

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall
TPZMatrix<TPZFlopCounter>::Decompose_Cholesky
          (TPZMatrix<TPZFlopCounter> *this,list<long,_std::allocator<long>_> *singular)

{
  list<long,_std::allocator<long>_> *plVar1;
  list<long,_std::allocator<long>_> *plVar2;
  bool bVar3;
  int iVar4;
  int64_t iVar5;
  int64_t iVar6;
  undefined4 extraout_var;
  TPZBaseMatrix *in_RDI;
  double __x;
  double dVar7;
  double __x_00;
  double dVar8;
  double __x_01;
  TPZFlopCounter tmp2;
  char *in_stack_000000a0;
  int64_t k_1;
  int64_t j;
  TPZFlopCounter tmp;
  int64_t k;
  int64_t i;
  int64_t dim;
  TPZFlopCounter in_stack_fffffffffffffea0;
  list<long,_std::allocator<long>_> *in_stack_fffffffffffffea8;
  list<long,_std::allocator<long>_> *in_stack_fffffffffffffeb0;
  undefined1 local_f8 [24];
  REAL local_e0 [5];
  REAL local_b8;
  REAL local_a8;
  long local_a0;
  list<long,_std::allocator<long>_> *local_98;
  double local_88;
  double local_80;
  TPZFlopCounter local_78;
  double local_70;
  TPZFlopCounter local_68 [4];
  REAL local_48;
  REAL local_38;
  long local_30;
  list<long,_std::allocator<long>_> *local_28;
  long local_20;
  
  if ((in_RDI->fDecomposed != '\0') && (in_RDI->fDecomposed != '\x03')) {
    Error(in_stack_000000a0,(char *)tmp2.fVal);
  }
  if (in_RDI->fDecomposed == '\0') {
    iVar5 = TPZBaseMatrix::Rows(in_RDI);
    iVar6 = TPZBaseMatrix::Cols(in_RDI);
    if (iVar5 != iVar6) {
      Error(in_stack_000000a0,(char *)tmp2.fVal);
    }
    iVar4 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0xc])();
    local_20 = CONCAT44(extraout_var,iVar4);
    for (local_28 = (list<long,_std::allocator<long>_> *)0x0; (long)local_28 < local_20;
        local_28 = (list<long,_std::allocator<long>_> *)
                   ((long)&(local_28->super__List_base<long,_std::allocator<long>_>)._M_impl._M_node
                           .super__List_node_base._M_next + 1)) {
      for (local_30 = 0; plVar1 = local_28, local_30 < (long)local_28; local_30 = local_30 + 1) {
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28,local_28);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28,local_30);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28,local_30);
        local_48 = (REAL)TPZFlopCounter::operator*
                                   ((TPZFlopCounter *)in_stack_fffffffffffffea8,
                                    in_stack_fffffffffffffea0.fVal);
        local_38 = (REAL)TPZFlopCounter::operator-
                                   ((TPZFlopCounter *)in_stack_fffffffffffffea8,
                                    in_stack_fffffffffffffea0.fVal);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,plVar1,plVar1,&local_38);
      }
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28,local_28);
      dVar7 = fabs(__x);
      local_70 = 1e-12;
      TPZFlopCounter::TPZFlopCounter(local_68,&local_70);
      dVar8 = fabs(__x_00);
      if (dVar7 <= dVar8) {
        std::__cxx11::list<long,_std::allocator<long>_>::push_back
                  (in_stack_fffffffffffffeb0,(value_type_conflict5 *)in_stack_fffffffffffffea8);
        plVar1 = local_28;
        local_80 = 1.0;
        TPZFlopCounter::TPZFlopCounter(&local_78,&local_80);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,plVar1,plVar1,&local_78);
      }
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28,local_28);
      local_88 = sqrt(__x_01);
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,local_28,local_28,&local_88);
      local_98 = local_28;
      while (local_98 = (list<long,_std::allocator<long>_> *)
                        ((long)&(local_98->super__List_base<long,_std::allocator<long>_>)._M_impl.
                                _M_node.super__List_node_base._M_next + 1),
            (long)local_98 < local_20) {
        for (local_a0 = 0; plVar2 = local_28, plVar1 = local_98, local_a0 < (long)local_28;
            local_a0 = local_a0 + 1) {
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28,local_98);
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28,local_a0);
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_a0,local_98);
          local_b8 = (REAL)TPZFlopCounter::operator*
                                     ((TPZFlopCounter *)in_stack_fffffffffffffea8,
                                      in_stack_fffffffffffffea0.fVal);
          local_a8 = (REAL)TPZFlopCounter::operator-
                                     ((TPZFlopCounter *)in_stack_fffffffffffffea8,
                                      in_stack_fffffffffffffea0.fVal);
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,plVar2,plVar1,&local_a8);
        }
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28,local_28);
        bVar3 = IsZero<TPZFlopCounter>(in_stack_fffffffffffffea0);
        if (bVar3) {
          Error(in_stack_000000a0,(char *)tmp2.fVal);
        }
        in_stack_fffffffffffffea0.fVal = (REAL)local_28;
        in_stack_fffffffffffffea8 = local_98;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28,local_98);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28,local_28);
        local_e0[0] = (REAL)TPZFlopCounter::operator/
                                      ((TPZFlopCounter *)in_stack_fffffffffffffea8,
                                       in_stack_fffffffffffffea0.fVal);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                  (in_RDI,in_stack_fffffffffffffea0.fVal,in_stack_fffffffffffffea8,local_e0);
        plVar1 = local_28;
        in_stack_fffffffffffffeb0 = local_98;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28,local_98);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                  (in_RDI,in_stack_fffffffffffffeb0,plVar1,local_f8);
      }
    }
    in_RDI->fDecomposed = '\x03';
  }
  return 3;
}

Assistant:

int TPZMatrix<TVar>::Decompose_Cholesky(std::list<int64_t> &singular) {
	if (  fDecomposed && fDecomposed != ECholesky) Error( "Decompose_Cholesky <Matrix already Decomposed>" );
	if (  fDecomposed ) return ECholesky;
	if ( Rows()!=Cols() ) Error( "Decompose_Cholesky <Matrix must be square>" );
	//return 0;
	
	int64_t dim=Dim();
	for (int64_t i=0 ; i<dim; i++) {
		for(int64_t k=0; k<i; k++) {             //elementos da diagonal
			PutVal( i,i,GetVal(i,i)-GetVal(i,k)*GetVal(i,k) );
		}
		if((fabs(GetVal(i,i))) <= fabs((TVar)1.e-12))
		{
			singular.push_back(i);
			PutVal(i,i,1.);
		}
		TVar tmp = sqrt(GetVal(i,i));
        PutVal( i,i,tmp );
        for (int64_t j=i+1;j<dim; j++) {           //elementos fora da diagonal
            for(int64_t k=0; k<i; k++) {
                PutVal( i,j,GetVal(i,j)-GetVal(i,k)*GetVal(k,j) );
            }
            TVar tmp2 = GetVal(i,i);
            if ( IsZero(tmp2) ) {
				Error( "Decompose_Cholesky <Zero on diagonal>" );
            }
            PutVal(i,j,GetVal(i,j)/GetVal(i,i) );
            PutVal(j,i,GetVal(i,j));
			
        }
    }
	fDecomposed = ECholesky;
	return ECholesky;
}